

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::EncodeVarint32(char *dst,uint32_t v)

{
  long lVar1;
  byte bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = (byte)v;
  if (v < 0x80) {
    *dst = bVar2;
    pcVar3 = dst + 1;
  }
  else if (v < 0x4000) {
    *dst = bVar2 | 0x80;
    dst[1] = (char)(v >> 7);
    pcVar3 = dst + 2;
  }
  else if (v < 0x200000) {
    *dst = bVar2 | 0x80;
    dst[1] = (byte)(v >> 7) | 0x80;
    dst[2] = (char)(v >> 0xe);
    pcVar3 = dst + 3;
  }
  else {
    *dst = bVar2 | 0x80;
    dst[1] = (byte)(v >> 7) | 0x80;
    dst[2] = (byte)(v >> 0xe) | 0x80;
    bVar2 = (byte)(v >> 0x15);
    if (v < 0x10000000) {
      dst[3] = bVar2;
      pcVar3 = dst + 4;
    }
    else {
      dst[3] = bVar2 | 0x80;
      dst[4] = (byte)(v >> 0x1c);
      pcVar3 = dst + 5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

char* EncodeVarint32(char* dst, uint32_t v) {
  // Operate on characters as unsigneds
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  static const int B = 128;
  if (v < (1 << 7)) {
    *(ptr++) = v;
  } else if (v < (1 << 14)) {
    *(ptr++) = v | B;
    *(ptr++) = v >> 7;
  } else if (v < (1 << 21)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = v >> 14;
  } else if (v < (1 << 28)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = v >> 21;
  } else {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = (v >> 21) | B;
    *(ptr++) = v >> 28;
  }
  return reinterpret_cast<char*>(ptr);
}